

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTInflateMap.cpp
# Opt level: O0

void __thiscall
TTD::InflateMap::LookupInfoForDebugScope
          (InflateMap *this,TTD_PTR_ID dbgScopeId,FunctionBody **homeBody,int32 *chainIndex)

{
  FunctionBody **ppFVar1;
  int *piVar2;
  int32 *chainIndex_local;
  FunctionBody **homeBody_local;
  TTD_PTR_ID dbgScopeId_local;
  InflateMap *this_local;
  
  ppFVar1 = TTDIdentifierDictionary<unsigned_long,_Js::FunctionBody_*>::LookupKnownItem
                      (&this->m_debuggerScopeHomeBodyMap,dbgScopeId);
  *homeBody = *ppFVar1;
  piVar2 = TTDIdentifierDictionary<unsigned_long,_int>::LookupKnownItem
                     (&this->m_debuggerScopeChainIndexMap,dbgScopeId);
  *chainIndex = *piVar2;
  return;
}

Assistant:

void InflateMap::LookupInfoForDebugScope(TTD_PTR_ID dbgScopeId, Js::FunctionBody** homeBody, int32* chainIndex) const
    {
        *homeBody = this->m_debuggerScopeHomeBodyMap.LookupKnownItem(dbgScopeId);
        *chainIndex = this->m_debuggerScopeChainIndexMap.LookupKnownItem(dbgScopeId);
    }